

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)300>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  Type *pTVar2;
  Type *pTVar3;
  int i;
  int iVar4;
  int index;
  undefined1 *puVar5;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_d9;
  Result *local_d8;
  TypeCase local_cc [3];
  string local_c0;
  Model *local_a0;
  Result result;
  GLMRegressor lr;
  
  puVar5 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar5 == (ModelDescription *)0x0) {
    puVar5 = Specification::_ModelDescription_default_instance_;
  }
  lr.super_MessageLite._vptr_MessageLite._0_4_ = 0;
  validateRegressorInterface
            (&result,(ModelDescription *)puVar5,format->specificationversion_,
             (ValidationPolicy *)&lr);
  bVar1 = Result::good(&result);
  if (bVar1) {
    iVar4 = 0;
    local_d8 = __return_storage_ptr__;
    local_a0 = format;
    do {
      if ((((ModelDescription *)puVar5)->input_).super_RepeatedPtrFieldBase.current_size_ <= iVar4)
      {
        iVar4 = 0;
        goto LAB_0026dc4a;
      }
      local_cc[0] = kDoubleType;
      local_cc[1] = kMultiArrayType;
      local_cc[2] = 1;
      __l._M_len = 3;
      __l._M_array = local_cc;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_c0,__l,&local_d9);
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(((ModelDescription *)puVar5)->input_).super_RepeatedPtrFieldBase,iVar4);
      validateSchemaTypes((Result *)&lr,
                          (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                           *)&local_c0,pTVar2);
      Result::operator=(&result,(Result *)&lr);
      std::__cxx11::string::~string((string *)&lr.super_MessageLite._internal_metadata_);
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                       *)&local_c0);
      bVar1 = Result::good(&result);
      iVar4 = iVar4 + 1;
      __return_storage_ptr__ = local_d8;
    } while (bVar1);
  }
  goto LAB_0026dcc1;
  while( true ) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
                       (&lr.weights_.super_RepeatedPtrFieldBase,index);
    index = index + 1;
    if ((pTVar3->value_).current_size_ != iVar4) break;
LAB_0026dd43:
    if (lr.weights_.super_RepeatedPtrFieldBase.current_size_ <= index) goto LAB_0026ddb8;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"All weight coefficients must be the same size.",
             (allocator<char> *)local_cc);
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c0);
LAB_0026ddac:
  std::__cxx11::string::~string((string *)&local_c0);
LAB_0026ddc0:
  Specification::GLMRegressor::~GLMRegressor(&lr);
  goto LAB_0026dcc9;
LAB_0026ddb8:
  Result::Result(__return_storage_ptr__);
  goto LAB_0026ddc0;
  while( true ) {
    local_cc[0] = 2;
    __l_00._M_len = 1;
    __l_00._M_array = local_cc;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_c0,__l_00,&local_d9);
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(((ModelDescription *)puVar5)->output_).super_RepeatedPtrFieldBase,iVar4);
    validateSchemaTypes((Result *)&lr,
                        (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                         *)&local_c0,pTVar2);
    Result::operator=(&result,(Result *)&lr);
    std::__cxx11::string::~string((string *)&lr.super_MessageLite._internal_metadata_);
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                     *)&local_c0);
    bVar1 = Result::good(&result);
    iVar4 = iVar4 + 1;
    __return_storage_ptr__ = local_d8;
    if (!bVar1) break;
LAB_0026dc4a:
    __return_storage_ptr__ = local_d8;
    if ((((ModelDescription *)puVar5)->output_).super_RepeatedPtrFieldBase.current_size_ <= iVar4) {
      if (local_a0->_oneof_case_[0] == 300) {
        puVar5 = (undefined1 *)(local_a0->Type_).glmregressor_;
      }
      else {
        puVar5 = Specification::_GLMRegressor_default_instance_;
      }
      Specification::GLMRegressor::GLMRegressor(&lr,(GLMRegressor *)puVar5);
      if (lr.weights_.super_RepeatedPtrFieldBase.current_size_ != lr.offset_.current_size_) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"Weights and offsets must be the same size.",
                   (allocator<char> *)local_cc);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c0);
        goto LAB_0026ddac;
      }
      if (lr.weights_.super_RepeatedPtrFieldBase.current_size_ < 1) goto LAB_0026ddb8;
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
                         (&lr.weights_.super_RepeatedPtrFieldBase,0);
      iVar4 = (pTVar3->value_).current_size_;
      index = 1;
      goto LAB_0026dd43;
    }
  }
LAB_0026dcc1:
  Result::Result(__return_storage_ptr__,&result);
LAB_0026dcc9:
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmRegressor>(const Specification::Model& format) {
        const Specification::ModelDescription& interface = format.description();

        // Must have a regressor interface (since GLMRegressor is an MLRegressor)
        Result result = validateRegressorInterface(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Check allowed output input & types are supported by this model.
        for (int i = 0; i < interface.input_size(); i++) {
            result = validateSchemaTypes({
                            Specification::FeatureType::kDoubleType,
                            Specification::FeatureType::kMultiArrayType,
                            Specification::FeatureType::kInt64Type
                      }, interface.input(i));
            if (!result.good()) {
                return result;
            }
        }
        for (int i = 0; i < interface.output_size(); i++) {
            result = validateSchemaTypes({
                Specification::FeatureType::kDoubleType,
            }, interface.output(i));

            if (!result.good()) {
                return result;
            }
        }
        
        // Linear regression specific type checking.
        // -------------------------------------------------------------------------
        auto lr = format.glmregressor();
        if (lr.weights_size() != lr.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Weights and offsets must be the same size.");
        }
        
        if (lr.weights_size() > 0) {
            int expected_size = lr.weights(0).value_size();
            for (int i = 1; i < lr.weights_size(); i++) {
                if (lr.weights(i).value_size() != expected_size) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "All weight coefficients must be the same size.");
                }
            }
        }
        return Result();
    }